

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_gsv_text.cpp
# Opt level: O0

void __thiscall agg::gsv_text::rewind(gsv_text *this,FILE *__stream)

{
  int16u iVar1;
  int16u iVar2;
  double local_30;
  double base_height;
  uint param_1_local;
  gsv_text *this_local;
  
  this->m_status = initial;
  if (this->m_font != (void *)0x0) {
    this->m_indices = (int8u *)this->m_font;
    iVar1 = value(this,this->m_indices + 4);
    iVar2 = value(this,this->m_indices);
    this->m_indices = this->m_indices + (int)(uint)iVar2;
    this->m_glyphs = (int8 *)(this->m_indices + 0x202);
    this->m_h = this->m_height / (double)iVar1;
    if ((this->m_width != 0.0) || (NAN(this->m_width))) {
      local_30 = this->m_width / (double)iVar1;
    }
    else {
      local_30 = this->m_h;
    }
    this->m_w = local_30;
    if ((this->m_flip & 1U) != 0) {
      this->m_h = -this->m_h;
    }
    this->m_cur_chr = this->m_text;
  }
  return;
}

Assistant:

void gsv_text::rewind(unsigned)
    {
        m_status = initial;
        if(m_font == 0) return;
        
        m_indices = (int8u*)m_font;
        double base_height = value(m_indices + 4);
        m_indices += value(m_indices);
        m_glyphs = (int8*)(m_indices + 257*2);
        m_h = m_height / base_height;
        m_w = (m_width == 0.0) ? m_h : m_width / base_height;
        if(m_flip) m_h = -m_h;
        m_cur_chr = m_text;
    }